

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

string * __thiscall DataSet::labels_string_abi_cxx11_(string *__return_storage_ptr__,DataSet *this)

{
  size_type sVar1;
  const_reference pvVar2;
  uint local_20;
  uint i;
  DataSet *this_local;
  string *labels;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_labels), local_20 < sVar1; local_20 = local_20 + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_labels,(ulong)local_20);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar2);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_labels);
    if ((ulong)local_20 < sVar1 - 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,',');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DataSet::labels_string() const{
    std::string labels;
    for(unsigned i=0;i<m_labels.size();++i){
        labels+=m_labels[i];
        if(i<m_labels.size()-1) labels+=',';
    }
    return labels;
}